

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O2

int N_VLinearCombination(int nvec,realtype *c,N_Vector *X,N_Vector z)

{
  _func_int_int_realtype_ptr_N_Vector_ptr_N_Vector *UNRECOVERED_JUMPTABLE;
  int iVar1;
  long lVar2;
  
  UNRECOVERED_JUMPTABLE = z->ops->nvlinearcombination;
  if (UNRECOVERED_JUMPTABLE != (_func_int_int_realtype_ptr_N_Vector_ptr_N_Vector *)0x0) {
    iVar1 = (*UNRECOVERED_JUMPTABLE)(nvec,c,X,z);
    return iVar1;
  }
  (*z->ops->nvscale)(*c,*X,z);
  for (lVar2 = 1; lVar2 < nvec; lVar2 = lVar2 + 1) {
    (*z->ops->nvlinearsum)(c[lVar2],X[lVar2],1.0,z,z);
  }
  return 0;
}

Assistant:

int N_VLinearCombination(int nvec, realtype* c, N_Vector* X, N_Vector z)
{
  int i;
  realtype ONE=RCONST(1.0);

  if (z->ops->nvlinearcombination != NULL) {

    return(z->ops->nvlinearcombination(nvec, c, X, z));

  } else {

    z->ops->nvscale(c[0], X[0], z);
    for (i=1; i<nvec; i++) {
      z->ops->nvlinearsum(c[i], X[i], ONE, z, z);
    }
    return(0);

  }
}